

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * lest::to_string<(anonymous_namespace)::Explicit>
                   (string *__return_storage_ptr__,Explicit *value)

{
  uint *puVar1;
  int iVar2;
  size_type *psVar3;
  ostringstream os;
  size_type *local_1b8;
  string *local_1b0;
  size_type local_1a8;
  undefined8 uStack_1a0;
  long local_198 [3];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  iVar2 = value->x;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Explicit:",9);
  std::ostream::operator<<((ostream *)local_198,iVar2);
  std::__cxx11::stringbuf::str();
  psVar3 = &local_1a8;
  if (local_1b8 != &local_1a8) {
    psVar3 = local_1b8;
  }
  local_1b8 = psVar3;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1b8 == &local_1a8) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1a8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1a0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1b8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1a8;
  }
  __return_storage_ptr__->_M_string_length = (size_type)local_1b0;
  return local_1b0;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}